

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O2

bool modify_stat(string *name,function<int_(int)> *f,Character *victim)

{
  World *pWVar1;
  ECF *pEVar2;
  bool bVar3;
  AdminLevel AVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  mapped_type *pmVar8;
  uchar uVar9;
  Skin SVar10;
  AdminLevel AVar11;
  uint uVar12;
  int iVar13;
  allocator<char> local_72;
  allocator<char> local_71;
  PacketBuilder builder;
  key_type local_40;
  
  bVar3 = std::operator==(name,"level");
  if (bVar3) {
    iVar5 = std::function<int_(int)>::operator()(f,(uint)victim->level);
    pWVar1 = victim->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&builder,"MaxLevel",(allocator<char> *)&local_40);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar1->config,(key_type *)&builder);
    iVar6 = util::variant::GetInt(pmVar8);
    iVar7 = 0;
    if (0 < iVar5) {
      iVar7 = iVar5;
    }
    uVar9 = (uchar)iVar7;
    if (iVar6 < iVar7) {
      uVar9 = (uchar)iVar6;
    }
    victim->level = uVar9;
LAB_0016bc10:
    std::__cxx11::string::~string((string *)&builder);
    bVar3 = true;
  }
  else {
    bVar3 = std::operator==(name,"exp");
    if (bVar3) {
      iVar5 = std::function<int_(int)>::operator()(f,victim->exp);
      pWVar1 = victim->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"MaxEXP",(allocator<char> *)&local_40);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&builder);
      iVar6 = util::variant::GetInt(pmVar8);
      iVar7 = 0;
      if (0 < iVar5) {
        iVar7 = iVar5;
      }
      if (iVar6 < iVar7) {
        iVar7 = iVar6;
      }
      victim->exp = iVar7;
      goto LAB_0016bc10;
    }
    bVar3 = std::operator==(name,"str");
    if (bVar3) {
      iVar7 = std::function<int_(int)>::operator()(f,victim->str);
      pWVar1 = victim->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"MaxStat",(allocator<char> *)&local_40);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&builder);
      iVar5 = util::variant::GetInt(pmVar8);
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (iVar5 < iVar7) {
        iVar7 = iVar5;
      }
      victim->str = iVar7;
LAB_0016bf6a:
      std::__cxx11::string::~string((string *)&builder);
LAB_0016bf74:
      bVar3 = false;
      iVar13 = 1;
LAB_0016bf77:
      Character::CalculateStats(victim,true);
      PacketBuilder::PacketBuilder(&builder,PACKET_RECOVER,PACKET_LIST,0x20);
      if (bVar3) {
        PacketBuilder::SetID(&builder,PACKET_STATSKILL,PACKET_PLAYER);
        uVar12 = victim->statpoints;
      }
      else {
        uVar12 = (uint)victim->clas;
      }
      PacketBuilder::AddShort(&builder,uVar12);
      PacketBuilder::AddShort(&builder,*victim->display_str);
      PacketBuilder::AddShort(&builder,*victim->display_intl);
      PacketBuilder::AddShort(&builder,*victim->display_wis);
      PacketBuilder::AddShort(&builder,*victim->display_agi);
      PacketBuilder::AddShort(&builder,*victim->display_con);
      PacketBuilder::AddShort(&builder,*victim->display_cha);
      PacketBuilder::AddShort(&builder,victim->maxhp);
      PacketBuilder::AddShort(&builder,victim->maxtp);
      PacketBuilder::AddShort(&builder,victim->maxsp);
      PacketBuilder::AddShort(&builder,victim->maxweight);
      PacketBuilder::AddShort(&builder,victim->mindam);
      PacketBuilder::AddShort(&builder,victim->maxdam);
      PacketBuilder::AddShort(&builder,victim->accuracy);
      PacketBuilder::AddShort(&builder,victim->evade);
      PacketBuilder::AddShort(&builder,victim->armor);
      Character::Send(victim,&builder);
      PacketBuilder::~PacketBuilder(&builder);
      if ((char)iVar13 != '\0') {
        return true;
      }
      goto LAB_0016bc80;
    }
    bVar3 = std::operator==(name,"int");
    if (bVar3) {
      iVar7 = std::function<int_(int)>::operator()(f,victim->intl);
      pWVar1 = victim->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"MaxStat",(allocator<char> *)&local_40);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&builder);
      iVar5 = util::variant::GetInt(pmVar8);
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (iVar5 < iVar7) {
        iVar7 = iVar5;
      }
      victim->intl = iVar7;
      goto LAB_0016bf6a;
    }
    bVar3 = std::operator==(name,"wis");
    if (bVar3) {
      iVar7 = std::function<int_(int)>::operator()(f,victim->wis);
      pWVar1 = victim->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"MaxStat",(allocator<char> *)&local_40);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&builder);
      iVar5 = util::variant::GetInt(pmVar8);
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (iVar5 < iVar7) {
        iVar7 = iVar5;
      }
      victim->wis = iVar7;
      goto LAB_0016bf6a;
    }
    bVar3 = std::operator==(name,"agi");
    if (bVar3) {
      iVar7 = std::function<int_(int)>::operator()(f,victim->agi);
      pWVar1 = victim->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"MaxStat",(allocator<char> *)&local_40);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&builder);
      iVar5 = util::variant::GetInt(pmVar8);
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (iVar5 < iVar7) {
        iVar7 = iVar5;
      }
      victim->agi = iVar7;
      goto LAB_0016bf6a;
    }
    bVar3 = std::operator==(name,"con");
    if (bVar3) {
      iVar7 = std::function<int_(int)>::operator()(f,victim->con);
      pWVar1 = victim->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"MaxStat",(allocator<char> *)&local_40);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&builder);
      iVar5 = util::variant::GetInt(pmVar8);
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (iVar5 < iVar7) {
        iVar7 = iVar5;
      }
      victim->con = iVar7;
      goto LAB_0016bf6a;
    }
    bVar3 = std::operator==(name,"cha");
    if (bVar3) {
      iVar7 = std::function<int_(int)>::operator()(f,victim->cha);
      pWVar1 = victim->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"MaxStat",(allocator<char> *)&local_40);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&builder);
      iVar5 = util::variant::GetInt(pmVar8);
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (iVar5 < iVar7) {
        iVar7 = iVar5;
      }
      victim->cha = iVar7;
      goto LAB_0016bf6a;
    }
    bVar3 = std::operator==(name,"statpoints");
    if (bVar3) {
      iVar7 = std::function<int_(int)>::operator()(f,victim->statpoints);
      pWVar1 = victim->world;
      std::__cxx11::string::string<std::allocator<char>>((string *)&builder,"MaxLevel",&local_71);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&builder);
      iVar5 = util::variant::GetInt(pmVar8);
      pWVar1 = victim->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"StatPerLevel",&local_72);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,&local_40);
      iVar6 = util::variant::GetInt(pmVar8);
      iVar13 = 0;
      if (iVar7 < 1) {
        iVar7 = iVar13;
      }
      if (iVar6 * iVar5 < iVar7) {
        iVar7 = iVar6 * iVar5;
      }
      victim->statpoints = iVar7;
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&builder);
      bVar3 = true;
      goto LAB_0016bf77;
    }
    bVar3 = std::operator==(name,"skillpoints");
    if (bVar3) {
      iVar5 = std::function<int_(int)>::operator()(f,victim->skillpoints);
      pWVar1 = victim->world;
      std::__cxx11::string::string<std::allocator<char>>((string *)&builder,"MaxLevel",&local_71);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&builder);
      iVar6 = util::variant::GetInt(pmVar8);
      pWVar1 = victim->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"SkillPerLevel",&local_72);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,&local_40);
      iVar13 = util::variant::GetInt(pmVar8);
      iVar7 = 0;
      if (0 < iVar5) {
        iVar7 = iVar5;
      }
      if (iVar13 * iVar6 < iVar7) {
        iVar7 = iVar13 * iVar6;
      }
      victim->skillpoints = iVar7;
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&builder);
      return true;
    }
    bVar3 = std::operator==(name,"admin");
    if (bVar3) {
      iVar7 = std::function<int_(int)>::operator()(f,(uint)victim->admin);
      AVar4 = (AdminLevel)iVar7;
      AVar11 = ADMIN_HGM;
      if (AVar4 < ADMIN_HGM) {
        AVar11 = AVar4;
      }
      if (AVar4 == ADMIN_PLAYER) {
        if (victim->admin != ADMIN_PLAYER) {
          World::DecAdminCount(victim->world);
        }
      }
      else if (victim->admin == ADMIN_PLAYER) {
        World::IncAdminCount(victim->world);
      }
      victim->admin = AVar11;
      goto LAB_0016bc80;
    }
    bVar3 = std::operator==(name,"gender");
    if (bVar3) {
      iVar7 = std::function<int_(int)>::operator()(f,(uint)victim->gender);
      victim->gender = (char)iVar7 != '\0';
      goto LAB_0016c47b;
    }
    bVar3 = std::operator==(name,"hairstyle");
    if (bVar3) {
      iVar5 = std::function<int_(int)>::operator()(f,(uint)victim->hairstyle);
      pWVar1 = victim->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"MaxHairStyle",(allocator<char> *)&local_40);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&builder);
      iVar6 = util::variant::GetInt(pmVar8);
      iVar7 = 0;
      if (0 < iVar5) {
        iVar7 = iVar5;
      }
      uVar9 = (uchar)iVar7;
      if (iVar6 < iVar7) {
        uVar9 = (uchar)iVar6;
      }
      victim->hairstyle = uVar9;
LAB_0016c471:
      std::__cxx11::string::~string((string *)&builder);
LAB_0016c47b:
      Character::Warp(victim,victim->map->id,victim->x,victim->y,WARP_ANIMATION_NONE);
      return true;
    }
    bVar3 = std::operator==(name,"haircolor");
    if (bVar3) {
      iVar5 = std::function<int_(int)>::operator()(f,(uint)victim->haircolor);
      pWVar1 = victim->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"MaxHairColor",(allocator<char> *)&local_40);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&builder);
      iVar6 = util::variant::GetInt(pmVar8);
      iVar7 = 0;
      if (0 < iVar5) {
        iVar7 = iVar5;
      }
      uVar9 = (uchar)iVar7;
      if (iVar6 < iVar7) {
        uVar9 = (uchar)iVar6;
      }
      victim->haircolor = uVar9;
      goto LAB_0016c471;
    }
    bVar3 = std::operator==(name,"race");
    if (bVar3) {
      iVar7 = std::function<int_(int)>::operator()(f,(uint)victim->race);
      pWVar1 = victim->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"MaxSkin",(allocator<char> *)&local_40);
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&builder);
      iVar5 = util::variant::GetInt(pmVar8);
      SVar10 = (Skin)iVar7;
      if ((Skin)iVar5 < (Skin)iVar7) {
        SVar10 = (Skin)iVar5;
      }
      victim->race = SVar10;
      goto LAB_0016c471;
    }
    bVar3 = std::operator==(name,"guildrank");
    if (bVar3) {
      iVar5 = std::function<int_(int)>::operator()(f,(uint)victim->guild_rank);
      iVar7 = 0;
      if (0 < iVar5) {
        iVar7 = iVar5;
      }
      uVar9 = '\t';
      if (iVar7 < 9) {
        uVar9 = (uchar)iVar7;
      }
      victim->guild_rank = uVar9;
      goto LAB_0016bc80;
    }
    bVar3 = std::operator==(name,"karma");
    if (!bVar3) {
      bVar3 = std::operator==(name,"class");
      if (!bVar3) {
        return false;
      }
      iVar7 = std::function<int_(int)>::operator()(f,(uint)victim->clas);
      pEVar2 = victim->world->ecf;
      iVar5 = (int)(((long)(pEVar2->data).
                           super__Vector_base<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pEVar2->data).
                          super__Vector_base<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x38) + -1;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      uVar9 = (uchar)iVar7;
      if (iVar5 < iVar7) {
        uVar9 = (uchar)iVar5;
      }
      victim->clas = uVar9;
      goto LAB_0016bf74;
    }
    iVar7 = std::function<int_(int)>::operator()(f,victim->karma);
    bVar3 = false;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    if (1999 < iVar7) {
      iVar7 = 2000;
    }
    victim->karma = iVar7;
  }
  PacketBuilder::PacketBuilder(&builder,PACKET_RECOVER,PACKET_REPLY,7);
  PacketBuilder::AddInt(&builder,victim->exp);
  PacketBuilder::AddShort(&builder,victim->karma);
  uVar12 = 0;
  if (bVar3) {
    uVar12 = (uint)victim->level;
  }
  PacketBuilder::AddChar(&builder,uVar12);
  Character::Send(victim,&builder);
  PacketBuilder::~PacketBuilder(&builder);
LAB_0016bc80:
  Character::CheckQuestRules(victim);
  return true;
}

Assistant:

static bool modify_stat(std::string name, std::function<int(int)> f, Character* victim)
{
	bool appearance = false;
	bool level = false;
	bool stats = false;
	bool karma = false;

	bool statpoints = false;
	bool skillpoints = false;

		 if (name == "level") (level = true, victim->level) = util::clamp<int>(f(victim->level), 0, victim->world->config["MaxLevel"]);
	else if (name == "exp")   (level = true, victim->exp)   = util::clamp<int>(f(victim->exp),   0, victim->world->config["MaxEXP"]);
	else if (name == "str")   (stats = true, victim->str)   = util::clamp<int>(f(victim->str),   0, victim->world->config["MaxStat"]);
	else if (name == "int")   (stats = true, victim->intl)  = util::clamp<int>(f(victim->intl),  0, victim->world->config["MaxStat"]);
	else if (name == "wis")   (stats = true, victim->wis)   = util::clamp<int>(f(victim->wis),   0, victim->world->config["MaxStat"]);
	else if (name == "agi")   (stats = true, victim->agi)   = util::clamp<int>(f(victim->agi),   0, victim->world->config["MaxStat"]);
	else if (name == "con")   (stats = true, victim->con)   = util::clamp<int>(f(victim->con),   0, victim->world->config["MaxStat"]);
	else if (name == "cha")   (stats = true, victim->cha)   = util::clamp<int>(f(victim->cha),   0, victim->world->config["MaxStat"]);
	else if (name == "statpoints")  (statpoints = true,  victim->statpoints)  = util::clamp<int>(f(victim->statpoints),  0, int(victim->world->config["MaxLevel"]) * int(victim->world->config["StatPerLevel"]));
	else if (name == "skillpoints") (skillpoints = true, victim->skillpoints) = util::clamp<int>(f(victim->skillpoints), 0, int(victim->world->config["MaxLevel"]) * int(victim->world->config["SkillPerLevel"]));
	else if (name == "admin")
	{
		AdminLevel level = util::clamp<AdminLevel>(AdminLevel(f(victim->admin)), ADMIN_PLAYER, ADMIN_HGM);

		if (level == ADMIN_PLAYER && victim->admin != ADMIN_PLAYER)
			victim->world->DecAdminCount();
		else if (level != ADMIN_PLAYER && victim->admin == ADMIN_PLAYER)
			victim->world->IncAdminCount();

		victim->admin = level;
	}
	else if (name == "gender")    (appearance = true, victim->gender)    = util::clamp<Gender>(Gender(f(victim->gender)), Gender(0), Gender(1));
	else if (name == "hairstyle") (appearance = true, victim->hairstyle) = util::clamp<int>(f(victim->hairstyle),         0, victim->world->config["MaxHairStyle"]);
	else if (name == "haircolor") (appearance = true, victim->haircolor) = util::clamp<int>(f(victim->haircolor),         0, victim->world->config["MaxHairColor"]);
	else if (name == "race")      (appearance = true, victim->race)      = util::clamp<Skin>(Skin(f(victim->race)),       Skin(0), Skin(int(victim->world->config["MaxSkin"])));
	else if (name == "guildrank") victim->guild_rank = util::clamp<int>(f(victim->guild_rank), 0, 9);
	else if (name == "karma") (karma = true, victim->karma) = util::clamp<int>(f(victim->karma), 0, 2000);
	else if (name == "class") (stats = true, victim->clas)  = util::clamp<int>(f(victim->clas),  0, victim->world->ecf->data.size() - 1);
	else return false;

	// Easiest way to get the character to update on everyone nearby's screen
	if (appearance)
		victim->Warp(victim->map->id, victim->x, victim->y);

	// TODO: Good way of updating skillpoints
	(void)skillpoints;

	if (stats || statpoints)
	{
		victim->CalculateStats();

		PacketBuilder builder(PACKET_RECOVER, PACKET_LIST, 32);

		if (statpoints)
		{
			builder.SetID(PACKET_STATSKILL, PACKET_PLAYER);
			builder.AddShort(victim->statpoints);
		}
		else
		{
			builder.AddShort(victim->clas);
		}

		builder.AddShort(victim->display_str);
		builder.AddShort(victim->display_intl);
		builder.AddShort(victim->display_wis);
		builder.AddShort(victim->display_agi);
		builder.AddShort(victim->display_con);
		builder.AddShort(victim->display_cha);
		builder.AddShort(victim->maxhp);
		builder.AddShort(victim->maxtp);
		builder.AddShort(victim->maxsp);
		builder.AddShort(victim->maxweight);
		builder.AddShort(victim->mindam);
		builder.AddShort(victim->maxdam);
		builder.AddShort(victim->accuracy);
		builder.AddShort(victim->evade);
		builder.AddShort(victim->armor);
		victim->Send(builder);
	}

	if (karma || level)
	{
		PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 7);
		builder.AddInt(victim->exp);
		builder.AddShort(victim->karma);
		builder.AddChar(level ? victim->level : 0);
		victim->Send(builder);
	}

	if (!stats && !skillpoints && !appearance)
	{
		victim->CheckQuestRules();
	}

	return true;
}